

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr
          (ExprVisitorDelegate *this,SimdShuffleOpExpr *expr)

{
  WatWriter *this_00;
  char *s;
  int32_t lane;
  long lVar1;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  this_00 = this->writer_;
  s = Opcode::GetName(&expr->opcode);
  WritePutsSpace(this_00,s);
  local_28 = *(undefined4 *)(expr->val).v;
  uStack_24 = *(undefined4 *)((expr->val).v + 4);
  uStack_20 = *(undefined4 *)((expr->val).v + 8);
  uStack_1c = *(undefined4 *)((expr->val).v + 0xc);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    Writef(this->writer_,"%u",(ulong)*(byte *)((long)&local_28 + lVar1));
  }
  WriteNewline(this->writer_,false);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr(
    SimdShuffleOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  std::array<uint8_t, 16> values = Bitcast<std::array<uint8_t, 16>>(expr->val);
  for (int32_t lane = 0; lane < 16; ++lane) {
    writer_->Writef("%u", values[lane]);
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}